

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int verify_miniscript_thresh(miniscript_node_t *node,miniscript_node_t *parent)

{
  uint uVar1;
  int32_t iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  int iVar7;
  uint32_t uVar8;
  miniscript_node_t *pmVar9;
  byte bVar10;
  int iVar11;
  byte bVar12;
  byte bVar13;
  bool bVar14;
  
  iVar2 = get_child_list_count(node);
  if (iVar2 < 4) {
    return -2;
  }
  pmVar9 = node->child;
  if (pmVar9->info != (miniscript_item_t *)0x0) {
    return -2;
  }
  if (pmVar9->kind != 8) {
    return -2;
  }
  if (pmVar9->number < 0) {
    return -2;
  }
  uVar5 = (uint)pmVar9->number;
  if (uVar5 == 0) {
    return -2;
  }
  bVar12 = 1;
  iVar7 = 0;
  bVar13 = 1;
  iVar11 = 0;
  uVar4 = 0;
  while (pmVar9 = pmVar9->next, pmVar9 != (miniscript_node_t *)0x0) {
    if (pmVar9->info == (miniscript_item_t *)0x0) {
      return -2;
    }
    uVar3 = pmVar9->type_properties;
    bVar14 = iVar7 == 0;
    iVar7 = iVar7 + -1;
    if (bVar14) {
      uVar1 = ~uVar3 & 0x1801;
    }
    else {
      uVar1 = ~uVar3 & 0x1808;
    }
    if (uVar1 != 0) {
      return -2;
    }
    bVar12 = (byte)(uVar3 >> 0xd) & 1 & bVar12;
    bVar13 = (byte)(uVar3 >> 0x10) & 1 & bVar13;
    uVar4 = uVar4 + ((uVar3 >> 0xf & 1) != 0);
    iVar11 = iVar11 + (2 - ((uVar3 >> 9 & 1) != 0) & (int)(uVar3 << 0x17) >> 0x1f);
  }
  if ((uint)-iVar7 < uVar5) {
    return -2;
  }
  node->type_properties = 0x1801;
  if (iVar11 == 0) {
    uVar8 = 0x1901;
  }
  else {
    uVar8 = 0x1801;
    if (iVar11 != 1) goto LAB_00167b08;
    uVar8 = 0x1a01;
  }
  node->type_properties = uVar8;
LAB_00167b08:
  bVar10 = -iVar7 == uVar4 & bVar12;
  uVar3 = 1 - (uVar5 + iVar7);
  bVar13 = bVar13 & bVar12 & -(uVar5 + iVar7) <= uVar4;
  if (((bVar10 != 0) || (bVar13 != 0)) || (uVar3 <= uVar4)) {
    uVar6 = uVar8 + 0x2000;
    if (bVar10 == 0) {
      uVar6 = uVar8;
    }
    uVar8 = uVar6 + 0x10000;
    if (bVar13 == 0) {
      uVar8 = uVar6;
    }
    uVar6 = uVar8 + 0x8000;
    if (uVar4 < uVar3) {
      uVar6 = uVar8;
    }
    node->type_properties = uVar6;
  }
  return 0;
}

Assistant:

static int verify_miniscript_thresh(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    struct miniscript_node_t *top = NULL;
    struct miniscript_node_t *child = NULL;
    uint32_t count = 0;
    uint32_t k = 0;
    bool all_e = true;
    bool all_m = true;
    uint32_t args = 0;
    uint32_t num_s = 0;
    (void)parent;

    if (get_child_list_count(node) < 4)
        return WALLY_EINVAL;

    top = node->child;
    if (top->info || (top->kind != DESCRIPTOR_KIND_NUMBER) || (top->number < 0))
        return WALLY_EINVAL;

    k = (uint32_t) top->number;
    if (k < 1)
        return WALLY_EINVAL;

    child = top->next;
    while (child) {
        if (!child->info)
            return WALLY_EINVAL;

        if (!count) {
            if (~(child->type_properties) & (MINISCRIPT_TYPE_B | MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_U))
                return WALLY_EINVAL;
        } else if (~(child->type_properties) & (MINISCRIPT_TYPE_W | MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_U))
            return WALLY_EINVAL;

        if (~(child->type_properties) & MINISCRIPT_PROPERTY_E)
            all_e = false;
        if (~(child->type_properties) & MINISCRIPT_PROPERTY_M)
            all_m = false;
        if ((child->type_properties) & MINISCRIPT_PROPERTY_S)
            ++num_s;
        if ((child->type_properties) & MINISCRIPT_PROPERTY_Z)
            args += (~(child->type_properties) & MINISCRIPT_PROPERTY_O) ? 2 : 1;

        ++count;
        child = child->next;
    }

    if (k > count)
        return WALLY_EINVAL;

    node->type_properties = MINISCRIPT_TYPE_B | MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_U;
    if (args == 0)
        node->type_properties |= MINISCRIPT_PROPERTY_Z;
    else if (args == 1)
        node->type_properties |= MINISCRIPT_PROPERTY_O;
    if (all_e && num_s == count)
        node->type_properties |= MINISCRIPT_PROPERTY_E;
    if (all_e && all_m && num_s >= count - k)
        node->type_properties |= MINISCRIPT_PROPERTY_M;
    if (num_s >= count - k + 1)
        node->type_properties |= MINISCRIPT_PROPERTY_S;

    return WALLY_OK;
}